

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testDeepImage.cpp
# Opt level: O0

void anon_unknown.dwarf_13b32::fillChannel<unsigned_int>(Rand48 *random,DeepImageChannel *c)

{
  uint uVar1;
  ImageChannel *this;
  ImageLevel *this_00;
  Box2i *pBVar2;
  DeepImageLevel *this_01;
  uint *puVar3;
  undefined8 in_RSI;
  double dVar4;
  int i;
  uint *s;
  int n;
  int x;
  int y;
  SampleCountChannel *scc;
  Box2i *dataWindow;
  TypedDeepImageChannel<unsigned_int> *tc;
  ImageChannel *rangeMax;
  int in_stack_ffffffffffffffb8;
  int in_stack_ffffffffffffffbc;
  SampleCountChannel *in_stack_ffffffffffffffc0;
  int local_30;
  int local_2c;
  
  this = (ImageChannel *)
         __dynamic_cast(in_RSI,&Imf_3_2::DeepImageChannel::typeinfo,
                        &Imf_3_2::TypedDeepImageChannel<unsigned_int>::typeinfo,0);
  if (this == (ImageChannel *)0x0) {
    __cxa_bad_cast();
  }
  rangeMax = this;
  this_00 = Imf_3_2::ImageChannel::level(this);
  pBVar2 = Imf_3_2::ImageLevel::dataWindow(this_00);
  this_01 = (DeepImageLevel *)Imf_3_2::DeepImageChannel::deepLevel();
  Imf_3_2::DeepImageLevel::sampleCounts(this_01);
  for (local_2c = (pBVar2->min).y; local_2c <= (pBVar2->max).y; local_2c = local_2c + 1) {
    for (local_30 = (pBVar2->min).x; local_30 <= (pBVar2->max).x; local_30 = local_30 + 1) {
      puVar3 = Imf_3_2::SampleCountChannel::at
                         (in_stack_ffffffffffffffc0,in_stack_ffffffffffffffbc,
                          in_stack_ffffffffffffffb8);
      uVar1 = *puVar3;
      in_stack_ffffffffffffffc0 =
           (SampleCountChannel *)
           Imf_3_2::TypedDeepImageChannel<unsigned_int>::at((int)this,local_30);
      for (in_stack_ffffffffffffffbc = 0; in_stack_ffffffffffffffbc < (int)uVar1;
          in_stack_ffffffffffffffbc = in_stack_ffffffffffffffbc + 1) {
        dVar4 = Imath_3_2::Rand48::nextf
                          ((Rand48 *)in_stack_ffffffffffffffc0,
                           (double)CONCAT44(in_stack_ffffffffffffffbc,in_stack_ffffffffffffffb8),
                           (double)rangeMax);
        *(int *)(in_stack_ffffffffffffffc0 + (long)in_stack_ffffffffffffffbc * 4) = (int)(long)dVar4
        ;
      }
    }
  }
  return;
}

Assistant:

void
fillChannel (Rand48& random, DeepImageChannel& c)
{
    //
    // Fill image channel tc with random numbers
    //

    TypedDeepImageChannel<T>& tc = dynamic_cast<TypedDeepImageChannel<T>&> (c);

    const Box2i&              dataWindow = tc.level ().dataWindow ();
    const SampleCountChannel& scc        = c.deepLevel ().sampleCounts ();

    for (int y = dataWindow.min.y; y <= dataWindow.max.y; ++y)
    {
        for (int x = dataWindow.min.x; x <= dataWindow.max.x; ++x)
        {
            int n = scc.at (x, y);
            T*  s = tc.at (x, y);

            for (int i = 0; i < n; ++i)
                s[i] = T (random.nextf (0.0, 100.0));
        }
    }
}